

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  shared_ptr<spdlog::logger> filelog;
  allocator local_5a;
  allocator local_59;
  undefined1 local_58 [48];
  filename_t local_28;
  
  spdlog::info<>("Sample Info output.");
  spdlog::warn<>("Sample Warn output.");
  spdlog::error<>("Sample Error output.");
  std::__cxx11::string::string((string *)&local_28,"sample-logger",&local_59);
  std::__cxx11::string::string((string *)(local_58 + 0x10),"sample-log.txt",&local_5a);
  spdlog::basic_logger_mt<spdlog::synchronous_factory>
            ((string *)local_58,&local_28,(bool)((char)local_58 + '\x10'));
  std::__cxx11::string::~string((string *)(local_58 + 0x10));
  std::__cxx11::string::~string((string *)&local_28);
  spdlog::logger::info<>((logger *)local_58._0_8_,"Sample Info output.");
  spdlog::logger::warn<>((logger *)local_58._0_8_,"Sample Warn output.");
  spdlog::logger::error<>((logger *)local_58._0_8_,"Sample Error output.");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return 0;
}

Assistant:

int main() {

  spdlog::info("Sample Info output.");
  spdlog::warn("Sample Warn output.");
  spdlog::error("Sample Error output.");

  auto filelog = spdlog::basic_logger_mt("sample-logger", "sample-log.txt");

  filelog.get()->info("Sample Info output.");
  filelog.get()->warn("Sample Warn output.");
  filelog.get()->error("Sample Error output.");

  return 0;
}